

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

bool DnsStats::IsIpv4Name(uint8_t *name,size_t name_length)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  
  bVar1 = true;
  uVar3 = 0;
  do {
    if (((name_length == 0) || (!bVar1)) || (3 < uVar3)) {
      return (bool)(uVar3 == 4 & bVar1);
    }
    iVar5 = 0;
    iVar4 = 1;
    bVar6 = 0;
    while ((name_length != 0 && (bVar1 != false))) {
      bVar6 = name[name_length - 1];
      if (9 < (byte)(bVar6 - 0x30)) {
        name_length = name_length - 1;
        goto LAB_00193065;
      }
      iVar7 = (bVar6 - 0x30) * iVar4;
      iVar2 = iVar4 * 10;
      if (999 < iVar4) {
        bVar1 = false;
        iVar7 = 0;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      iVar5 = iVar5 + iVar7;
      name_length = name_length - 1;
    }
    if (bVar1 != false) {
LAB_00193065:
      uVar3 = uVar3 + (iVar5 < 0x100 && (bVar6 == 0x2e || name_length == 0));
      if (iVar5 >= 0x100 || bVar6 != 0x2e && name_length != 0) {
        bVar1 = false;
      }
    }
  } while( true );
}

Assistant:

bool DnsStats::IsIpv4Name(const uint8_t * name, size_t name_length)
{
    int nb_num_dot = 0;
    size_t i;
    bool is_ipv4 = true;

    i = name_length;
    while (i > 0 && is_ipv4 && nb_num_dot < 4) {
        int mult = 1;
        int r = 0;
        int c = 0;

        while (is_ipv4 && i > 0) {
            i--;
            c = name[i];
            if (c >= '0' && c <= '9') {
                if (mult < 1000) {
                    r += mult * (c - '0');
                    mult *= 10;
                }
                else {
                    is_ipv4 = false;
                }
            }
            else {
                break;
            }
        }

        if (is_ipv4) {
            if ((i == 0 || c == '.') && r < 256) {
                nb_num_dot++;
            }
            else {
                is_ipv4 = false;
            }
        }
    }

    is_ipv4 &= (nb_num_dot == 4);

    return is_ipv4;
}